

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  string *psVar2;
  bool bVar3;
  TemplateRecord *pTVar4;
  ulong uVar5;
  reference ppTVar6;
  reference ppTVar7;
  int local_3ac;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_318;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_310;
  iterator it_3;
  string local_2e8 [8];
  string output_1;
  undefined1 local_2c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  template_filenames_1;
  string local_290 [8];
  string output_file;
  string local_270 [8];
  string basename;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_250;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_248;
  __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_240;
  const_iterator it_2;
  string local_218 [8];
  string cleantext;
  string local_1f8 [8];
  string output;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_1d8;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_1d0;
  __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_1c8;
  const_iterator it_1;
  string all_header_entries;
  undefined1 local_1a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  template_filenames;
  undefined1 local_180 [8];
  string progname;
  TemplateString local_160;
  string *local_140;
  Template *tpl;
  char *tplname;
  __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
  local_128;
  iterator it;
  int num_errors;
  TemplateRecord *local_f8;
  TemplateRecord *template_rec;
  undefined1 local_e8 [4];
  int i;
  vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> template_records;
  undefined1 local_c8 [4];
  int r;
  int option_index;
  bool FLAG_log_info;
  bool FLAG_dump_templates;
  bool FLAG_header;
  string FLAG_outputfile;
  allocator local_99;
  string local_98 [8];
  string FLAG_outputfile_suffix;
  allocator local_71;
  string local_70 [8];
  string FLAG_header_dir;
  allocator local_39;
  string local_38 [8];
  string FLAG_template_dir;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)&ctemplate::kCWD,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)&ctemplate::kCWD,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ctemplate::NormalizeDirectory(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,".varnames.h",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&option_index,"",(allocator *)((long)&r + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&r + 3));
  r._2_1_ = 1;
  r._1_1_ = 0;
  r._0_1_ = 1;
  template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_0010965d:
  do {
    do {
      if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
        if (argc <= _optind) {
          LogPrintf(3,(byte)r & 1,"Must specify at least one template file on the command line.");
        }
        ctemplate::Template::SetTemplateRootDirectory((string *)local_38);
        std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::vector
                  ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8);
        for (template_rec._4_4_ = _optind; template_rec._4_4_ < argc;
            template_rec._4_4_ = template_rec._4_4_ + 1) {
          pTVar4 = (TemplateRecord *)operator_new(0x48);
          it._M_current._6_1_ = 1;
          pcVar1 = argv[template_rec._4_4_];
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&num_errors,pcVar1,(allocator *)((long)&it._M_current + 7));
          TemplateRecord::TemplateRecord(pTVar4,(string *)&num_errors);
          it._M_current._6_1_ = 0;
          std::__cxx11::string::~string((string *)&num_errors);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
          local_f8 = pTVar4;
          std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::push_back
                    ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8,
                     &local_f8);
        }
        it._M_current._0_4_ = 0;
        local_128._M_current =
             (TemplateRecord **)
             std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::begin
                       ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8);
        while( true ) {
          tplname = (char *)std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::end
                                      ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>
                                        *)local_e8);
          bVar3 = __gnu_cxx::operator!=
                            (&local_128,
                             (__normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                              *)&tplname);
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
          ::operator*(&local_128);
          tpl = (Template *)std::__cxx11::string::c_str();
          LogPrintf(0,(byte)r & 1,"\n------ Checking %s ------",tpl);
          ctemplate::TemplateString::TemplateString(&local_160,(char *)tpl);
          local_140 = (string *)ctemplate::Template::GetTemplate(&local_160,DO_NOT_STRIP);
          if (local_140 == (string *)0x0) {
            LogPrintf(2,(byte)r & 1,"Could not load file: %s",tpl);
            it._M_current._0_4_ = (int)it._M_current + 1;
            ppTVar7 = __gnu_cxx::
                      __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                      ::operator*(&local_128);
            (*ppTVar7)->error = true;
          }
          else {
            LogPrintf(0,(byte)r & 1,"No syntax errors detected in %s",tpl);
            psVar2 = local_140;
            if ((r._1_1_ & 1) != 0) {
              ctemplate::Template::template_file();
              ctemplate::Template::Dump((char *)psVar2);
            }
            psVar2 = local_140;
            if ((r._2_1_ & 1) != 0) {
              __gnu_cxx::
              __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
              ::operator*(&local_128);
              ctemplate::Template::WriteHeaderEntries(psVar2);
            }
          }
          __gnu_cxx::
          __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
          ::operator++(&local_128);
        }
        if ((r._2_1_ & 1) != 0) {
          pcVar1 = *argv;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_180,pcVar1,
                     (allocator *)
                     ((long)&template_filenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&template_filenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            if ((int)it._M_current == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1a0);
              std::__cxx11::string::string((string *)&it_1);
              local_1d0._M_current =
                   (TemplateRecord **)
                   std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::begin
                             ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)
                              local_e8);
              __gnu_cxx::
              __normal_iterator<TemplateRecord*const*,std::vector<TemplateRecord*,std::allocator<TemplateRecord*>>>
              ::__normal_iterator<TemplateRecord**>
                        ((__normal_iterator<TemplateRecord*const*,std::vector<TemplateRecord*,std::allocator<TemplateRecord*>>>
                          *)&local_1c8,&local_1d0);
              while( true ) {
                local_1d8._M_current =
                     (TemplateRecord **)
                     std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::end
                               ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)
                                local_e8);
                bVar3 = __gnu_cxx::operator!=(&local_1c8,&local_1d8);
                if (!bVar3) break;
                __gnu_cxx::
                __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                ::operator*(&local_1c8);
                std::__cxx11::string::append((string *)&it_1);
                ppTVar6 = __gnu_cxx::
                          __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                          ::operator*(&local_1c8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1a0,&(*ppTVar6)->name);
                __gnu_cxx::
                __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                ::operator++(&local_1c8);
              }
              Boilerplate(local_1f8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_180);
              TextWithDuplicateLinesRemoved(local_218);
              WrapWithGuard((string *)&it_2,(string *)&option_index);
              std::__cxx11::string::append((string *)local_1f8);
              std::__cxx11::string::~string((string *)&it_2);
              bVar3 = WriteToDisk((bool)((byte)r & 1),(string *)&option_index,local_1f8);
              if (!bVar3) {
                it._M_current._0_4_ = (int)it._M_current + 1;
              }
              std::__cxx11::string::~string((string *)local_218);
              std::__cxx11::string::~string((string *)local_1f8);
              std::__cxx11::string::~string((string *)&it_1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1a0);
            }
          }
          else {
            local_248._M_current =
                 (TemplateRecord **)
                 std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::begin
                           ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8)
            ;
            __gnu_cxx::
            __normal_iterator<TemplateRecord*const*,std::vector<TemplateRecord*,std::allocator<TemplateRecord*>>>
            ::__normal_iterator<TemplateRecord**>
                      ((__normal_iterator<TemplateRecord*const*,std::vector<TemplateRecord*,std::allocator<TemplateRecord*>>>
                        *)&local_240,&local_248);
            while( true ) {
              local_250._M_current =
                   (TemplateRecord **)
                   std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::end
                             ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)
                              local_e8);
              bVar3 = __gnu_cxx::operator!=(&local_240,&local_250);
              if (!bVar3) break;
              ppTVar6 = __gnu_cxx::
                        __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                        ::operator*(&local_240);
              if (((*ppTVar6)->error & 1U) == 0) {
                __gnu_cxx::
                __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                ::operator*(&local_240);
                ctemplate::Basename(local_270);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &template_filenames_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_270);
                ctemplate::PathJoin(local_290,local_70);
                std::__cxx11::string::~string
                          ((string *)
                           &template_filenames_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2c8);
                ppTVar6 = __gnu_cxx::
                          __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                          ::operator*(&local_240);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c8,&(*ppTVar6)->name);
                Boilerplate(local_2e8,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_180);
                __gnu_cxx::
                __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                ::operator*(&local_240);
                WrapWithGuard((string *)&it_3,(string *)local_290);
                std::__cxx11::string::append((string *)local_2e8);
                std::__cxx11::string::~string((string *)&it_3);
                bVar3 = WriteToDisk((bool)((byte)r & 1),(string *)local_290,local_2e8);
                if (!bVar3) {
                  it._M_current._0_4_ = (int)it._M_current + 1;
                }
                std::__cxx11::string::~string((string *)local_2e8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2c8);
                std::__cxx11::string::~string(local_290);
                std::__cxx11::string::~string(local_270);
              }
              __gnu_cxx::
              __normal_iterator<TemplateRecord_*const_*,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
              ::operator++(&local_240);
            }
          }
          std::__cxx11::string::~string((string *)local_180);
        }
        local_310._M_current =
             (TemplateRecord **)
             std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::begin
                       ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8);
        while( true ) {
          local_318._M_current =
               (TemplateRecord **)
               std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::end
                         ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8);
          bVar3 = __gnu_cxx::operator!=(&local_310,&local_318);
          if (!bVar3) break;
          ppTVar7 = __gnu_cxx::
                    __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
                    ::operator*(&local_310);
          pTVar4 = *ppTVar7;
          if (pTVar4 != (TemplateRecord *)0x0) {
            TemplateRecord::~TemplateRecord(pTVar4);
            operator_delete(pTVar4);
          }
          __gnu_cxx::
          __normal_iterator<TemplateRecord_**,_std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>_>
          ::operator++(&local_310);
        }
        if ((int)it._M_current < 0x80) {
          local_3ac = (int)it._M_current;
        }
        else {
          local_3ac = 0x7f;
        }
        argv_local._4_4_ = local_3ac;
        template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::~vector
                  ((vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> *)local_e8);
LAB_0010a27e:
        std::__cxx11::string::~string((string *)&option_index);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_38);
        return argv_local._4_4_;
      }
      template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           getopt_long(argc,argv,"t:o:s:f:ndqhV",main::longopts,local_c8);
    } while (template_records.
             super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ == -1);
    if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x56) {
      Version(_stdout);
      argv_local._4_4_ = 0;
      template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_0010a27e;
    }
    if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 100) {
      if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x66) {
        std::__cxx11::string::assign((char *)&option_index);
      }
      else {
        if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x68) {
          Usage(*argv,_stderr);
          argv_local._4_4_ = 0;
          template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          goto LAB_0010a27e;
        }
        if (template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x6e) {
          r._2_1_ = 0;
        }
        else if (template_records.
                 super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ == 0x6f) {
          std::__cxx11::string::assign((char *)local_70);
        }
        else if (template_records.
                 super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ == 0x71) {
          r._0_1_ = 0;
        }
        else if (template_records.
                 super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ == 0x73) {
          std::__cxx11::string::assign((char *)local_98);
        }
        else {
          if (template_records.
              super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ != 0x74) {
            Usage(*argv,_stderr);
            argv_local._4_4_ = 1;
            template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_0010a27e;
          }
          std::__cxx11::string::assign((char *)local_38);
        }
      }
      goto LAB_0010965d;
    }
    r._1_1_ = 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  string FLAG_template_dir(GOOGLE_NAMESPACE::kCWD);   // "./"
  string FLAG_header_dir(GOOGLE_NAMESPACE::kCWD);
  GOOGLE_NAMESPACE::NormalizeDirectory(&FLAG_header_dir);   // adds trailing slash
  string FLAG_outputfile_suffix(".varnames.h");
  string FLAG_outputfile("");
  bool FLAG_header = true;
  bool FLAG_dump_templates = false;
  bool FLAG_log_info = true;

#if defined(HAVE_GETOPT_LONG)
  static struct option longopts[] = {
    {"help", 0, NULL, 'h'},
    {"version", 0, NULL, 'V'},
    {"template_dir", 1, NULL, 't'},
    {"header_dir", 1, NULL, 'o'},
    {"outputfile_suffix", 1, NULL, 's'},
    {"outputfile", 1, NULL, 'f'},
    {"noheader", 0, NULL, 'n'},
    {"dump_templates", 0, NULL, 'd'},
    {"nolog_info", 0, NULL, 'q'},
    {"v", 1, NULL, 'q'},
    {0, 0, 0, 0}
  };
  int option_index;
# define GETOPT(argc, argv)  getopt_long(argc, argv, "t:o:s:f:ndqhV", \
                                         longopts, &option_index)
#elif defined(HAVE_GETOPT_H)
# define GETOPT(argc, argv)  getopt(argc, argv, "t:o:s:f:ndqhV")
#else    // TODO(csilvers): implement something reasonable for windows
# define GETOPT(argc, argv)  -1
  int optind = 1;    // first non-opt argument
  const char* optarg = "";   // not used
#endif

  int r = 0;
  while (r != -1) {   // getopt()/getopt_long() return -1 upon no-more-input
    r = GETOPT(argc, argv);
    switch (r) {
      case 't': FLAG_template_dir.assign(optarg); break;
      case 'o': FLAG_header_dir.assign(optarg); break;
      case 's': FLAG_outputfile_suffix.assign(optarg); break;
      case 'f': FLAG_outputfile.assign(optarg); break;
      case 'n': FLAG_header = false; break;
      case 'd': FLAG_dump_templates = true; break;
      case 'q': FLAG_log_info = false; break;
      case 'V': Version(stdout); return 0; break;
      case 'h': Usage(argv[0], stderr); return 0; break;
      case -1: break;   // means 'no more input'
      default: Usage(argv[0], stderr); return 1; break;
    }
  }

  if (optind >= argc) {
    LogPrintf(LOG_FATAL, FLAG_log_info,
              "Must specify at least one template file on the command line.");
  }

  Template::SetTemplateRootDirectory(FLAG_template_dir);


  // Initialize the TemplateRecord array. It holds one element per
  // template given on the command-line.
  vector<TemplateRecord*> template_records;
  for (int i = optind; i < argc; ++i) {
    TemplateRecord *template_rec = new TemplateRecord(argv[i]);
    template_records.push_back(template_rec);
  }

  // Iterate through each template and (unless -n is given), write
  // its header entries into the headers array.
  int num_errors = 0;
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    const char* tplname = (*it)->name.c_str();
    LogPrintf(LOG_INFO, FLAG_log_info, "\n------ Checking %s ------", tplname);

    // The last two arguments in the following call do not matter
    // since they control how the template gets expanded and we never
    // expand the template after loading it here
    Template * tpl = Template::GetTemplate(tplname, GOOGLE_NAMESPACE::DO_NOT_STRIP);

    // The call to GetTemplate (above) loads the template from disk
    // and attempts to parse it. If it cannot find the file or if it
    // detects any template syntax errors, the parsing routines
    // report the error and GetTemplate returns NULL. Syntax errors
    // include such things as mismatched double-curly-bracket pairs,
    // e.g. '{{VAR}', Invalid characters in template variables or
    // section names, e.g.  '{{BAD_VAR?}}' [the question mark is
    // illegal], improperly nested section/end section markers,
    // e.g. a section close marker with no section start marker or a
    // section start of a different name.
    // If that happens, since the parsing errors have already been reported
    // we just continue on to the next one.
    if (!tpl) {
      LogPrintf(LOG_ERROR, FLAG_log_info, "Could not load file: %s", tplname);
      num_errors++;
      (*it)->error = true;
      continue;
    } else {
      LogPrintf(LOG_INFO, FLAG_log_info, "No syntax errors detected in %s",
                tplname);
      if (FLAG_dump_templates)
        tpl->Dump(tpl->template_file());
    }

    // The rest of the loop creates the header file
    if (!FLAG_header)
      continue;            // They don't want header files

    tpl->WriteHeaderEntries(&((*it)->header_entries));
  }

  // We have headers to emit:
  // . If --outputfile was given, we combine all the header entries and
  //   write them to the given output file. If any template had errors,
  //   we fail and do not generate an output file.
  // . Otherwise, we write one output file per template we processed.
  // . In both cases, we add proper boilerplate first.
  if (FLAG_header) {
    string progname = argv[0];

    if (!FLAG_outputfile.empty()) {  // All header entries written to one file.
      // If any template had an error, we do not produce an output file.
      if (num_errors == 0) {
        vector<string> template_filenames;
        string all_header_entries;
        for (vector<TemplateRecord*>::const_iterator
             it = template_records.begin(); it != template_records.end(); ++it) {
          all_header_entries.append((*it)->header_entries);
          template_filenames.push_back((*it)->name);
        }
        string output = Boilerplate(progname, template_filenames);
        const string cleantext =
            TextWithDuplicateLinesRemoved(all_header_entries);
        output.append(WrapWithGuard(FLAG_outputfile, cleantext));
        if (!WriteToDisk(FLAG_log_info, FLAG_outputfile, output))
          num_errors++;
      }
    } else {
      // Each template will have its own output file. Skip any that had errors.
      for (vector<TemplateRecord*>::const_iterator
           it = template_records.begin(); it != template_records.end(); ++it) {
        if ((*it)->error)
          continue;
        string basename = GOOGLE_NAMESPACE::Basename((*it)->name);
        string output_file =
            GOOGLE_NAMESPACE::PathJoin(FLAG_header_dir,
                                basename + FLAG_outputfile_suffix);
        vector<string> template_filenames;   // Contains one template filename.
        template_filenames.push_back((*it)->name);
        string output = Boilerplate(progname, template_filenames);
        output.append(WrapWithGuard(output_file, (*it)->header_entries));
        if (!WriteToDisk(FLAG_log_info, output_file, output))
          num_errors++;
      }
    }
  }

  // Free dynamic memory
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    delete *it;
  }

  // Cap at 127 to avoid causing problems with return code
  return num_errors > 127 ? 127 : num_errors;
}